

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegExecErrInfo(xmlRegExecCtxtPtr exec,xmlChar **string,int *nbval,int *nbneg,xmlChar **values
                     ,int *terminal)

{
  int *terminal_local;
  xmlChar **values_local;
  int *nbneg_local;
  int *nbval_local;
  xmlChar **string_local;
  xmlRegExecCtxtPtr exec_local;
  
  if (exec == (xmlRegExecCtxtPtr)0x0) {
    exec_local._4_4_ = -1;
  }
  else {
    if (string != (xmlChar **)0x0) {
      if (exec->status == 0) {
        *string = (xmlChar *)0x0;
      }
      else {
        *string = exec->errString;
      }
    }
    exec_local._4_4_ = xmlRegExecGetValues(exec,1,nbval,nbneg,values,terminal);
  }
  return exec_local._4_4_;
}

Assistant:

int
xmlRegExecErrInfo(xmlRegExecCtxtPtr exec, const xmlChar **string,
                  int *nbval, int *nbneg, xmlChar **values, int *terminal) {
    if (exec == NULL)
        return(-1);
    if (string != NULL) {
        if (exec->status != 0)
	    *string = exec->errString;
	else
	    *string = NULL;
    }
    return(xmlRegExecGetValues(exec, 1, nbval, nbneg, values, terminal));
}